

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.cpp
# Opt level: O2

bool ParseHDKeypath(string *keypath_str,vector<unsigned_int,_std::allocator<unsigned_int>_> *keypath
                   )

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  size_type sVar6;
  bool bVar7;
  long in_FS_OFFSET;
  string_view str;
  uint32_t path;
  uint32_t number;
  string item;
  stringstream ss;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)keypath_str,_S_out|_S_in);
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  bVar3 = true;
  do {
    while( true ) {
      bVar7 = bVar3;
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ss,(string *)&item,'/');
      uVar1 = *(uint *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18) + 0x20);
      if ((uVar1 & 5) != 0) goto LAB_0060819e;
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&item,"m");
      if (iVar4 == 0) break;
      path = 0;
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&item,'\'',0);
      if (sVar6 != 0xffffffffffffffff) {
        if (sVar6 != item._M_string_length - 1) goto LAB_0060819e;
        path = path | 0x80000000;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&number,
                   &item,0,sVar6);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&item,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &number);
        std::__cxx11::string::~string((string *)&number);
      }
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_not_of(&item,"0123456789",0);
      if (sVar6 != 0xffffffffffffffff) goto LAB_0060819e;
      str._M_str = item._M_dataplus._M_p;
      str._M_len = item._M_string_length;
      bVar3 = ParseUInt32(str,&number);
      if (!bVar3) goto LAB_0060819e;
      path = path | number;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(keypath,&path);
      bVar3 = false;
    }
    bVar3 = false;
  } while (bVar7);
LAB_0060819e:
  std::__cxx11::string::~string((string *)&item);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (uVar1 & 5) != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseHDKeypath(const std::string& keypath_str, std::vector<uint32_t>& keypath)
{
    std::stringstream ss(keypath_str);
    std::string item;
    bool first = true;
    while (std::getline(ss, item, '/')) {
        if (item.compare("m") == 0) {
            if (first) {
                first = false;
                continue;
            }
            return false;
        }
        // Finds whether it is hardened
        uint32_t path = 0;
        size_t pos = item.find('\'');
        if (pos != std::string::npos) {
            // The hardened tick can only be in the last index of the string
            if (pos != item.size() - 1) {
                return false;
            }
            path |= 0x80000000;
            item = item.substr(0, item.size() - 1); // Drop the last character which is the hardened tick
        }

        // Ensure this is only numbers
        if (item.find_first_not_of( "0123456789" ) != std::string::npos) {
            return false;
        }
        uint32_t number;
        if (!ParseUInt32(item, &number)) {
            return false;
        }
        path |= number;

        keypath.push_back(path);
        first = false;
    }
    return true;
}